

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.cxx
# Opt level: O2

bool cmSetDirectoryPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_49;
  string local_48 [32];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"called with incorrect number of arguments",&local_49);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (((int)pbVar3 - (int)pbVar1 & 0x20U) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"Wrong number of arguments",&local_49);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __lhs = pbVar1 + 1;
    while( true ) {
      if (__lhs == pbVar3) {
        return true;
      }
      bVar2 = std::operator==(__lhs,"VARIABLES");
      if (bVar2) break;
      bVar2 = std::operator==(__lhs,"MACROS");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_48,"Commands and macros cannot be set using SET_CMAKE_PROPERTIES",&local_49
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_00320f6f;
      }
      cmMakefile::SetProperty(status->Makefile,__lhs,__lhs + 1);
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __lhs = __lhs + 2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_48,"Variables and cache variables should be set using SET command",&local_49);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_00320f6f:
  std::__cxx11::string::~string(local_48);
  return false;
}

Assistant:

bool cmSetDirectoryPropertiesCommand(std::vector<std::string> const& args,
                                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // PROPERTIES followed by prop value pairs
  if (args.size() % 2 != 1) {
    status.SetError("Wrong number of arguments");
    return false;
  }

  for (auto iter = args.begin() + 1; iter != args.end(); iter += 2) {
    const std::string& prop = *iter;
    if (prop == "VARIABLES") {
      status.SetError(
        "Variables and cache variables should be set using SET command");
      return false;
    }
    if (prop == "MACROS") {
      status.SetError(
        "Commands and macros cannot be set using SET_CMAKE_PROPERTIES");
      return false;
    }
    status.GetMakefile().SetProperty(prop, *(iter + 1));
  }

  return true;
}